

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateSerializeWithCachedSizes
          (MapFieldGenerator *this,Printer *printer,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Type TVar4;
  Type TVar5;
  Descriptor *pDVar6;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  char *pcVar7;
  char *pcVar8;
  string utf8_check;
  string local_98;
  MapFieldGenerator *local_78;
  string local_70;
  string local_50;
  
  io::Printer::Print(printer,variables,"if (!this->$name$().empty()) {\n");
  io::Printer::Indent(printer);
  local_78 = this;
  pDVar6 = FieldDescriptor::message_type(this->descriptor_);
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"key","");
  this_00 = Descriptor::FindFieldByName(pDVar6,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  pDVar6 = FieldDescriptor::message_type(local_78->descriptor_);
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"value","");
  this_01 = Descriptor::FindFieldByName(pDVar6,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  TVar4 = FieldDescriptor::type(this_00);
  TVar5 = FieldDescriptor::type(this_01);
  io::Printer::Print(printer,variables,
                     "typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_pointer\n    ConstPtr;\n"
                    );
  pcVar7 = 
  "typedef ::google::protobuf::internal::SortItem< $key_cpp$, ConstPtr > SortItem;\ntypedef ::google::protobuf::internal::CompareByFirstField<SortItem> Less;\n"
  ;
  if (TVar4 == TYPE_STRING) {
    pcVar7 = 
    "typedef ConstPtr SortItem;\ntypedef ::google::protobuf::internal::CompareByDerefFirst<SortItem> Less;\n"
    ;
  }
  io::Printer::Print(printer,variables,pcVar7);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  if ((TVar4 == TYPE_STRING) || (TVar5 == TYPE_STRING)) {
    io::Printer::Print(printer,"struct Utf8Check {\n  static void Check(ConstPtr p) {\n");
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    if (TVar4 == TYPE_STRING) {
      GenerateUtf8CheckCodeForString
                (this_00,(local_78->super_FieldGenerator).options_,false,variables,
                 "p->first.data(), p->first.length(),\n",printer);
    }
    if (TVar5 == TYPE_STRING) {
      GenerateUtf8CheckCodeForString
                (this_01,(local_78->super_FieldGenerator).options_,false,variables,
                 "p->second.data(), p->second.length(),\n",printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  }\n};\n");
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)local_98._M_string_length,0x37d02a);
  }
  io::Printer::Print(printer,variables,
                     "\nif ($deterministic$ &&\n    this->$name$().size() > 1) {\n  ::google::protobuf::scoped_array<SortItem> items(\n      new SortItem[this->$name$().size()]);\n  typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::size_type size_type;\n  size_type n = 0;\n  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n      it = this->$name$().begin();\n      it != this->$name$().end(); ++it, ++n) {\n    items[n] = SortItem(&*it);\n  }\n  ::std::sort(&items[0], &items[n], Less());\n"
                    );
  io::Printer::Indent(printer);
  bVar3 = *(bool *)(*(long *)(*(long *)(local_78->descriptor_ + 0x30) + 0xa0) + 0xa7);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"for (size_type i = 0; i < n; i++)","");
  pcVar7 = "items[i].second";
  if (TVar4 == TYPE_STRING) {
    pcVar7 = "items[i]";
  }
  paVar2 = &local_70.field_2;
  pcVar8 = pcVar7 + 0xf;
  if (TVar4 == TYPE_STRING) {
    pcVar8 = pcVar7 + 8;
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar7,pcVar8);
  GenerateSerializationLoop(printer,variables,bVar3,&local_98,&local_50,&local_70,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"} else {\n");
  io::Printer::Indent(printer);
  bVar3 = *(bool *)(*(long *)(*(long *)(local_78->descriptor_ + 0x30) + 0xa0) + 0xa7);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n    it = this->$name$().begin();\n    it != this->$name$().end(); ++it)"
             ,"");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"it","");
  GenerateSerializationLoop(printer,variables,bVar3,&local_98,&local_50,&local_70,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void MapFieldGenerator::GenerateSerializeWithCachedSizes(
    io::Printer* printer, const std::map<string, string>& variables) const {
  printer->Print(variables,
      "if (!this->$name$().empty()) {\n");
  printer->Indent();
  const FieldDescriptor* key_field =
      descriptor_->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_field =
      descriptor_->message_type()->FindFieldByName("value");
  const bool string_key = key_field->type() == FieldDescriptor::TYPE_STRING;
  const bool string_value = value_field->type() == FieldDescriptor::TYPE_STRING;

  printer->Print(variables,
      "typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_pointer\n"
      "    ConstPtr;\n");
  if (string_key) {
    printer->Print(variables,
        "typedef ConstPtr SortItem;\n"
        "typedef ::google::protobuf::internal::"
        "CompareByDerefFirst<SortItem> Less;\n");
  } else {
    printer->Print(variables,
        "typedef ::google::protobuf::internal::SortItem< $key_cpp$, ConstPtr > "
        "SortItem;\n"
        "typedef ::google::protobuf::internal::CompareByFirstField<SortItem> Less;\n");
  }
  string utf8_check;
  if (string_key || string_value) {
    printer->Print(
        "struct Utf8Check {\n"
        "  static void Check(ConstPtr p) {\n");
    printer->Indent();
    printer->Indent();
    if (string_key) {
      GenerateUtf8CheckCodeForString(key_field, options_, false, variables,
                                     "p->first.data(), p->first.length(),\n",
                                     printer);
    }
    if (string_value) {
      GenerateUtf8CheckCodeForString(value_field, options_, false, variables,
                                     "p->second.data(), p->second.length(),\n",
                                     printer);
    }
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "};\n");
    utf8_check = "Utf8Check::Check";
  }

  printer->Print(variables,
      "\n"
      "if ($deterministic$ &&\n"
      "    this->$name$().size() > 1) {\n"
      "  ::google::protobuf::scoped_array<SortItem> items(\n"
      "      new SortItem[this->$name$().size()]);\n"
      "  typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::size_type size_type;\n"
      "  size_type n = 0;\n"
      "  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "      it = this->$name$().begin();\n"
      "      it != this->$name$().end(); ++it, ++n) {\n"
      "    items[n] = SortItem(&*it);\n"
      "  }\n"
      "  ::std::sort(&items[0], &items[n], Less());\n");
  printer->Indent();
  GenerateSerializationLoop(printer, variables, SupportsArenas(descriptor_),
                            utf8_check, "for (size_type i = 0; i < n; i++)",
                            string_key ? "items[i]" : "items[i].second", false);
  printer->Outdent();
  printer->Print(
      "} else {\n");
  printer->Indent();
  GenerateSerializationLoop(
      printer, variables, SupportsArenas(descriptor_), utf8_check,
      "for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "    it = this->$name$().begin();\n"
      "    it != this->$name$().end(); ++it)",
      "it", true);
  printer->Outdent();
  printer->Print("}\n");
  printer->Outdent();
  printer->Print("}\n");
}